

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_ep_match(udp_ep *ep)

{
  nni_aio *aio;
  void *item;
  
  aio = (nni_aio *)nni_list_first(&ep->connaios);
  item = nni_list_first(&ep->connpipes);
  if (item == (void *)0x0 || aio == (nni_aio *)0x0) {
    return;
  }
  nni_aio_list_remove(aio);
  nni_list_remove(&ep->connpipes,item);
  nni_aio_set_output(aio,0,*(void **)((long)item + 8));
  nni_aio_finish(aio,NNG_OK,0);
  return;
}

Assistant:

static void
udp_ep_match(udp_ep *ep)
{
	nng_aio  *aio = nni_list_first(&ep->connaios);
	udp_pipe *p   = nni_list_first(&ep->connpipes);

	if ((aio == NULL) || (p == NULL)) {
		return;
	}

	nni_aio_list_remove(aio);
	nni_list_remove(&ep->connpipes, p);
	nni_aio_set_output(aio, 0, p->npipe);
	nni_aio_finish(aio, 0, 0);
}